

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNMatrix SUNSparseMatrix(sunindextype M,sunindextype N,sunindextype NNZ,int sparsetype,
                         SUNContext sunctx)

{
  int *piVar1;
  void *pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_EDI;
  SUNMatrixContent_Sparse content;
  SUNMatrix A;
  SUNMatrix local_8;
  
  if (((in_EDI < 1) || (in_ESI < 1)) || (in_EDX < 0)) {
    local_8 = (SUNMatrix)0x0;
  }
  else if ((in_ECX == 0) || (in_ECX == 1)) {
    local_8 = SUNMatNewEmpty((SUNContext)0x0);
    if (local_8 == (SUNMatrix)0x0) {
      local_8 = (SUNMatrix)0x0;
    }
    else {
      local_8->ops->getid = SUNMatGetID_Sparse;
      local_8->ops->clone = SUNMatClone_Sparse;
      local_8->ops->destroy = SUNMatDestroy_Sparse;
      local_8->ops->zero = SUNMatZero_Sparse;
      local_8->ops->copy = SUNMatCopy_Sparse;
      local_8->ops->scaleadd = SUNMatScaleAdd_Sparse;
      local_8->ops->scaleaddi = SUNMatScaleAddI_Sparse;
      local_8->ops->matvec = SUNMatMatvec_Sparse;
      local_8->ops->space = SUNMatSpace_Sparse;
      piVar1 = (int *)malloc(0x50);
      if (piVar1 == (int *)0x0) {
        SUNMatDestroy((SUNMatrix)0xed4793);
        local_8 = (SUNMatrix)0x0;
      }
      else {
        local_8->content = piVar1;
        piVar1[6] = in_ECX;
        *piVar1 = in_EDI;
        piVar1[1] = in_ESI;
        piVar1[2] = in_EDX;
        if (in_ECX == 0) {
          piVar1[3] = in_ESI;
          *(int **)(piVar1 + 0xc) = piVar1 + 8;
          *(int **)(piVar1 + 0xe) = piVar1 + 10;
          piVar1[0x10] = 0;
          piVar1[0x11] = 0;
          piVar1[0x12] = 0;
          piVar1[0x13] = 0;
        }
        else if (in_ECX == 1) {
          piVar1[3] = in_EDI;
          *(int **)(piVar1 + 0x10) = piVar1 + 8;
          *(int **)(piVar1 + 0x12) = piVar1 + 10;
          piVar1[0xc] = 0;
          piVar1[0xd] = 0;
          piVar1[0xe] = 0;
          piVar1[0xf] = 0;
        }
        piVar1[4] = 0;
        piVar1[5] = 0;
        piVar1[8] = 0;
        piVar1[9] = 0;
        piVar1[10] = 0;
        piVar1[0xb] = 0;
        pvVar2 = calloc((long)in_EDX,8);
        *(void **)(piVar1 + 4) = pvVar2;
        if (*(long *)(piVar1 + 4) == 0) {
          SUNMatDestroy((SUNMatrix)0xed48e7);
          local_8 = (SUNMatrix)0x0;
        }
        else {
          pvVar2 = calloc((long)in_EDX,4);
          *(void **)(piVar1 + 8) = pvVar2;
          if (*(long *)(piVar1 + 8) == 0) {
            SUNMatDestroy((SUNMatrix)0xed4926);
            local_8 = (SUNMatrix)0x0;
          }
          else {
            pvVar2 = calloc((long)(piVar1[3] + 1),4);
            *(void **)(piVar1 + 10) = pvVar2;
            if (*(long *)(piVar1 + 10) == 0) {
              SUNMatDestroy((SUNMatrix)0xed496b);
              local_8 = (SUNMatrix)0x0;
            }
            else {
              *(undefined4 *)(*(long *)(piVar1 + 10) + (long)piVar1[3] * 4) = 0;
            }
          }
        }
      }
    }
  }
  else {
    local_8 = (SUNMatrix)0x0;
  }
  return local_8;
}

Assistant:

SUNMatrix SUNSparseMatrix(sunindextype M, sunindextype N,
                          sunindextype NNZ, int sparsetype,
                          SUNContext sunctx)
{
  SUNMatrix A;
  SUNMatrixContent_Sparse content;

  /* return with NULL matrix on illegal input */
  if ( (M <= 0) || (N <= 0) || (NNZ < 0) ) return(NULL);
  if ( (sparsetype != CSC_MAT) && (sparsetype != CSR_MAT) ) return(NULL);

  /* Create an empty matrix object */
  A = NULL;
  A = SUNMatNewEmpty(sunctx);
  if (A == NULL) return(NULL);

  /* Attach operations */
  A->ops->getid     = SUNMatGetID_Sparse;
  A->ops->clone     = SUNMatClone_Sparse;
  A->ops->destroy   = SUNMatDestroy_Sparse;
  A->ops->zero      = SUNMatZero_Sparse;
  A->ops->copy      = SUNMatCopy_Sparse;
  A->ops->scaleadd  = SUNMatScaleAdd_Sparse;
  A->ops->scaleaddi = SUNMatScaleAddI_Sparse;
  A->ops->matvec    = SUNMatMatvec_Sparse;
  A->ops->space     = SUNMatSpace_Sparse;

  /* Create content */
  content = NULL;
  content = (SUNMatrixContent_Sparse) malloc(sizeof *content);
  if (content == NULL) { SUNMatDestroy(A); return(NULL); }

  /* Attach content */
  A->content = content;

  /* Fill content */
  content->sparsetype = sparsetype;
  content->M = M;
  content->N = N;
  content->NNZ = NNZ;
  switch(sparsetype){
  case CSC_MAT:
    content->NP = N;
    content->rowvals = &(content->indexvals);
    content->colptrs = &(content->indexptrs);
    /* CSR indices */
    content->colvals = NULL;
    content->rowptrs = NULL;
    break;
  case CSR_MAT:
    content->NP = M;
    content->colvals = &(content->indexvals);
    content->rowptrs = &(content->indexptrs);
    /* CSC indices */
    content->rowvals = NULL;
    content->colptrs = NULL;
  }
  content->data      = NULL;
  content->indexvals = NULL;
  content->indexptrs = NULL;

  /* Allocate content */
  content->data = (realtype *) calloc(NNZ, sizeof(realtype));
  if (content->data == NULL) { SUNMatDestroy(A); return(NULL); }

  content->indexvals = (sunindextype *) calloc(NNZ, sizeof(sunindextype));
  if (content->indexvals == NULL) { SUNMatDestroy(A); return(NULL); }

  content->indexptrs = (sunindextype *) calloc((content->NP + 1), sizeof(sunindextype));
  if (content->indexptrs == NULL) { SUNMatDestroy(A); return(NULL); }
  content->indexptrs[content->NP] = 0;

  return(A);
}